

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::PeriodicDelaunay3dThread::get_lifted_vertex
          (PeriodicDelaunay3dThread *this,index_t v,double *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint local_24;
  index_t instance;
  double *result_local;
  index_t v_local;
  PeriodicDelaunay3dThread *this_local;
  
  local_24 = 0;
  result_local._4_4_ = v;
  if ((this->periodic_ & 1U) != 0) {
    local_24 = Periodic::periodic_vertex_instance(&this->super_Periodic,v);
    result_local._4_4_ = Periodic::periodic_vertex_real(&this->super_Periodic,v);
  }
  *result = this->vertices_[result_local._4_4_ * 3];
  result[1] = this->vertices_[result_local._4_4_ * 3 + 1];
  result[2] = this->vertices_[result_local._4_4_ * 3 + 2];
  dVar1 = non_periodic_weight(this,result_local._4_4_);
  result[3] = -dVar1;
  if ((this->periodic_ & 1U) != 0) {
    *result = (double)*(int *)(Periodic::translation + (ulong)local_24 * 0xc) * this->period_ +
              *result;
    result[1] = (double)*(int *)(Periodic::translation + (ulong)local_24 * 0xc + 4) * this->period_
                + result[1];
    result[2] = (double)*(int *)(Periodic::translation + (ulong)local_24 * 0xc + 8) * this->period_
                + result[2];
  }
  dVar1 = geo_sqr<double>(*result);
  dVar2 = geo_sqr<double>(result[1]);
  dVar3 = geo_sqr<double>(result[2]);
  result[3] = dVar1 + dVar2 + dVar3 + result[3];
  return;
}

Assistant:

void get_lifted_vertex(index_t v, double* result) const {
	    index_t instance = 0;
	    if(periodic_) {
		instance = periodic_vertex_instance(v);
		v = periodic_vertex_real(v);
	    }
	    result[0] = vertices_[3*v];
	    result[1] = vertices_[3*v+1];
	    result[2] = vertices_[3*v+2];
	    result[3] = -non_periodic_weight(v);
	    if(periodic_) {
		result[0] += double(translation[instance][0]) * period_;
		result[1] += double(translation[instance][1]) * period_;
		result[2] += double(translation[instance][2]) * period_;
	    }
	    result[3] +=
		geo_sqr(result[0]) + geo_sqr(result[1]) + geo_sqr(result[2]);
	}